

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

linepart __thiscall
mpt::layout::graph::transform3::part(transform3 *this,uint dim,double *val,int len)

{
  float fVar1;
  double dVar2;
  double local_58;
  double trim;
  double cut;
  data *curr;
  range l;
  int len_local;
  double *val_local;
  uint dim_local;
  transform3 *this_local;
  linepart lp;
  
  l.max._4_4_ = len;
  range::range((range *)&curr);
  cut = 0.0;
  if (dim == 0) {
    cut = (double)this->_dim;
  }
  else if (dim == 1) {
    cut = (double)(this->_dim + 1);
  }
  else if (dim == 2) {
    cut = (double)(this->_dim + 2);
  }
  linepart::linepart((linepart *)&this_local,0,-1);
  if ((cut == 0.0) || ((*(uint *)((long)cut + 0xc) & 0x10) == 0)) {
    mpt_linepart_linear(&this_local,val,(long)l.max._4_4_,0);
  }
  else {
    if ((*(uint *)((long)cut + 0xc) & 0x20) == 0) {
      curr = *(data **)((long)cut + 0x18);
      l.min = *(double *)((long)cut + 0x20);
    }
    else {
      dVar2 = floor(*(double *)((long)cut + 0x18));
      curr = (data *)exp10(dVar2);
      dVar2 = ceil(*(double *)((long)cut + 0x20));
      l.min = exp10(dVar2);
    }
    mpt_linepart_linear(&this_local,val,(long)l.max._4_4_,&curr);
    if ((*(uint *)((long)cut + 0xc) & 0x20) != 0) {
      fVar1 = linepart::cut((linepart *)&this_local);
      trim = (double)fVar1;
      fVar1 = linepart::trim((linepart *)&this_local);
      local_58 = (double)fVar1;
      if ((trim != 0.0) || (NAN(trim))) {
        trim = log10(trim);
      }
      if ((local_58 != 0.0) || (NAN(local_58))) {
        local_58 = log10(local_58);
      }
      linepart::set_cut((linepart *)&this_local,(float)trim);
      linepart::set_trim((linepart *)&this_local,(float)local_58);
    }
  }
  return (linepart)this_local;
}

Assistant:

linepart layout::graph::transform3::part(unsigned dim, const double *val, int len) const
{
	struct range l;
	const data *curr = 0;
	
	switch (dim) {
		case 0: curr = &_dim[0]; break;
		case 1: curr = &_dim[1]; break;
		case 2: curr = &_dim[2]; break;
	}
	linepart lp;
	
	if (!curr
	 || !(curr->_flags & TransformLimit)) {
		mpt_linepart_linear(&lp, val, len, 0);
		return lp;
	}
	if (curr->_flags & TransformLg) {
		l.min = exp10(floor(curr->limit.min));
		l.max = exp10(ceil(curr->limit.max));
	} else {
		l = curr->limit;
	}
	mpt_linepart_linear(&lp, val, len, &l);
	
	if (curr->_flags & TransformLg) {
		double cut  = lp.cut();
		double trim = lp.trim();
		
		if (cut) cut = log10(cut);
		if (trim) trim = log10(trim);
		
		lp.set_cut(cut);
		lp.set_trim(trim);
	}
	return lp;
}